

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void ZopfliResetHash(size_t window_size,ZopfliHash *h)

{
  int *piVar1;
  size_t sVar2;
  long lVar3;
  
  h->val = 0;
  piVar1 = h->head;
  for (lVar3 = 0; lVar3 != 0x10000; lVar3 = lVar3 + 1) {
    piVar1[lVar3] = -1;
  }
  for (sVar2 = 0; window_size != sVar2; sVar2 = sVar2 + 1) {
    h->prev[sVar2] = (unsigned_short)sVar2;
    h->hashval[sVar2] = -1;
  }
  for (sVar2 = 0; window_size != sVar2; sVar2 = sVar2 + 1) {
    h->same[sVar2] = 0;
  }
  h->val2 = 0;
  piVar1 = h->head2;
  for (lVar3 = 0; lVar3 != 0x10000; lVar3 = lVar3 + 1) {
    piVar1[lVar3] = -1;
  }
  for (sVar2 = 0; window_size != sVar2; sVar2 = sVar2 + 1) {
    h->prev2[sVar2] = (unsigned_short)sVar2;
    h->hashval2[sVar2] = -1;
  }
  return;
}

Assistant:

void ZopfliResetHash(size_t window_size, ZopfliHash* h) {
  size_t i;

  h->val = 0;
  for (i = 0; i < 65536; i++) {
    h->head[i] = -1;  /* -1 indicates no head so far. */
  }
  for (i = 0; i < window_size; i++) {
    h->prev[i] = i;  /* If prev[j] == j, then prev[j] is uninitialized. */
    h->hashval[i] = -1;
  }

#ifdef ZOPFLI_HASH_SAME
  for (i = 0; i < window_size; i++) {
    h->same[i] = 0;
  }
#endif

#ifdef ZOPFLI_HASH_SAME_HASH
  h->val2 = 0;
  for (i = 0; i < 65536; i++) {
    h->head2[i] = -1;
  }
  for (i = 0; i < window_size; i++) {
    h->prev2[i] = i;
    h->hashval2[i] = -1;
  }
#endif
}